

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slimc.c
# Opt level: O2

object * constDefinition(void)

{
  item *x;
  object *poVar1;
  char *msg;
  
  x = (item *)calloc(1,0x30);
  if ((currentSymbol - 0x25fU < 0xf) && ((0x4005U >> (currentSymbol - 0x25fU & 0x1f) & 1) != 0)) {
    getSymbol();
    if (currentSymbol == 0x1f5) {
      poVar1 = newObj(0x2bd);
      getSymbol();
      if (currentSymbol == 0x65) {
        getSymbol();
        simpleExpression(x);
        if (x->mode == 0x2bd) {
          poVar1->val = x->a;
          poVar1->typeIndex = x->typeIndex;
        }
        return poVar1;
      }
      msg = "missing assignment operator";
    }
    else {
      msg = "missing identifier in constant defintion";
    }
  }
  else {
    msg = "bad type in constant definition";
  }
  mark(msg);
  exit(-1);
}

Assistant:

object * constDefinition(void)  {
	variable struct object *obj;
	variable struct item *x;
	x = NULL; obj = NULL;
	allocMem(x);
	if ((currentSymbol == SYMBOL_INT) || (currentSymbol == SYMBOL_CHAR) || (currentSymbol == SYMBOL_BOOL)) {
		getSymbol();
		if (currentSymbol == SYMBOL_IDENTIFIER) {
			obj = newObj(CLASS_CONST);
			getSymbol();
			if (currentSymbol == SYMBOL_ASSIGN) {
				getSymbol();
				simpleExpression(x);
				if (x->mode == CLASS_CONST) {
					obj->val = x->a;
					obj->typeIndex = x->typeIndex;
				}
			} else {
				mark("missing assignment operator");
				exit(-1);
			}
		} else {
			mark("missing identifier in constant defintion");
			exit(-1);
		}
	} else {
		mark("bad type in constant definition");
		exit(-1);
	}
	return obj;
}